

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O3

void __thiscall
pstore::region::region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper>::append
          (region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t offset,uint64_t bytes_to_map)

{
  bool bVar1;
  ulong uVar2;
  in_memory *file;
  pointer psVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer psVar6;
  uint64_t uVar7;
  ulong uVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<pstore::memory_mapper_base> local_60;
  region_builder<pstore::file::in_memory,_(anonymous_namespace)::mock_mapper> *local_50;
  _func_int **local_48;
  _func_int **pp_Stack_40;
  
  if (regions.ptr_ ==
      (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
       *)0x0) {
    assert_failed("regions != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                  ,0x7c);
  }
  uVar2 = this->minimum_size_;
  if (offset % uVar2 == 0) {
    uVar8 = (bytes_to_map + uVar2) - 1;
    uVar8 = uVar8 - uVar8 % uVar2;
    if (uVar8 % uVar2 != 0) {
      assert_failed("bytes_to_map % minimum_size_ == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                    ,0x7f);
    }
    if (uVar8 != 0) {
      uVar7 = this->full_size_;
      local_50 = this;
      do {
        if (uVar8 < uVar7) {
          uVar7 = uVar8;
        }
        if (uVar7 < local_50->minimum_size_) {
          assert_failed("size >= minimum_size_",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                        ,0xa2);
        }
        file = (local_50->file_).
               super___shared_ptr<pstore::file::in_memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        bVar1 = file->writable_;
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x88);
        p_Var5->_M_use_count = 1;
        p_Var5->_M_weak_count = 1;
        p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0026f0b0;
        in_memory_mapper::pointer((in_memory_mapper *)&local_48,file,offset);
        *(_func_int ***)&p_Var5[1]._M_use_count = local_48;
        p_Var5[2]._vptr__Sp_counted_base = pp_Stack_40;
        *(bool *)&p_Var5[2]._M_use_count = bVar1;
        p_Var5[3]._vptr__Sp_counted_base = (_func_int **)offset;
        p_Var5[3]._M_use_count = (int)uVar7;
        p_Var5[3]._M_weak_count = (int)(uVar7 >> 0x20);
        p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR__mock_mapper_0026f100;
        testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
                  ((UntypedFunctionMockerBase *)(p_Var5 + 4));
        p_Var5[4]._vptr__Sp_counted_base = (_func_int **)&PTR__FunctionMocker_0026f560;
        local_60.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(p_Var5 + 1);
        local_60.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var5;
        std::
        vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>
        ::emplace_back<std::shared_ptr<pstore::memory_mapper_base>>
                  ((vector<std::shared_ptr<pstore::memory_mapper_base>,std::allocator<std::shared_ptr<pstore::memory_mapper_base>>>
                    *)regions.ptr_,&local_60);
        if (local_60.super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_60.
                     super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        uVar8 = uVar8 - uVar7;
        uVar7 = local_50->full_size_;
        offset = offset + uVar7;
      } while (uVar8 != 0);
    }
    psVar6 = ((regions.ptr_)->
             super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    psVar3 = ((regions.ptr_)->
             super__Vector_base<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (psVar6 != psVar3) {
      uVar7 = 0;
      do {
        peVar4 = (psVar6->super___shared_ptr<pstore::memory_mapper_base,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        if (peVar4->offset_ != uVar7) {
          assert_failed("region->offset () == p",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                        ,0xb4);
        }
        uVar7 = uVar7 + peVar4->size_;
        psVar6 = psVar6 + 1;
      } while (psVar6 != psVar3);
    }
    return;
  }
  assert_failed("offset % minimum_size_ == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                ,0x7d);
}

Assistant:

void region_builder<File, MemoryMapper>::append (gsl::not_null<container_type *> regions,
                                                         std::uint64_t offset,
                                                         std::uint64_t bytes_to_map) {
            PSTORE_ASSERT (regions != nullptr);
            PSTORE_ASSERT (offset % minimum_size_ == 0);
            bytes_to_map = round_up (bytes_to_map, minimum_size_);
            PSTORE_ASSERT (bytes_to_map % minimum_size_ == 0);

            // Zero or more regions whose size is a multiple of minimum-size but no
            // more than full-size.
            while (bytes_to_map > 0) {
                // Map no more than "full size" in one go.
                std::uint64_t const size = std::min (full_size_, bytes_to_map);

                bytes_to_map -= size;
                this->push (regions, bytes_to_map,
                            offset, // start of region
                            size);  // size of region
                offset += full_size_;
            }
            this->check_regions_are_contiguous (*regions);
        }